

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O0

axbStatus_t
axbVecAXPBYPCZ(axbVec_s *z,axbScalar_s *alpha,axbScalar_s *beta,axbScalar_s *gamma,axbVec_s *x,
              axbVec_s *y)

{
  _func_axbStatus_t_axbVec_s_ptr_axbScalar_s_ptr_axbScalar_s_ptr_axbScalar_s_ptr_axbVec_s_ptr_axbVec_s_ptr_void_ptr
  *op;
  axbOpDescriptor_t op_desc;
  axbVec_s *y_local;
  axbVec_s *x_local;
  axbScalar_s *gamma_local;
  axbScalar_s *beta_local;
  axbScalar_s *alpha_local;
  axbVec_s *z_local;
  
  op_desc._48_8_ = y;
  if (x->init == 0x1d232) {
    if (y->init == 0x1d232) {
      if (z->init == 0x1d232) {
        memcpy(&op,z->opBackend->op_table + 0x12,0x38);
        (*op)(z,alpha,beta,gamma,x,(axbVec_s *)op_desc._48_8_,op_desc.func);
        z_local._4_4_ = 0;
      }
      else {
        fprintf(_stderr,"Vector not fully initialized!\n");
        z_local._4_4_ = 0x1d232;
      }
    }
    else {
      fprintf(_stderr,"Vector not fully initialized!\n");
      z_local._4_4_ = 0x1d232;
    }
  }
  else {
    fprintf(_stderr,"Vector not fully initialized!\n");
    z_local._4_4_ = 0x1d232;
  }
  return z_local._4_4_;
}

Assistant:

axbStatus_t axbVecAXPBYPCZ(struct axbVec_s *z, const struct axbScalar_s *alpha, const struct axbScalar_s *beta, const struct axbScalar_s *gamma, const struct axbVec_s *x, const struct axbVec_s *y)
{
  AXB_VECTOR_INIT_CHECK(x);
  AXB_VECTOR_INIT_CHECK(y);
  AXB_VECTOR_INIT_CHECK(z);

  axbOpDescriptor_t op_desc = z->opBackend->op_table[AXB_OP_VEC_AXPBYPCZ];
  axbStatus_t (*op)(struct axbVec_s *, const struct axbScalar_s *, const struct axbScalar_s *, const struct axbScalar_s *, const struct axbVec_s *, const struct axbVec_s *, void*) = (axbStatus_t (*)(struct axbVec_s *, const struct axbScalar_s *, const struct axbScalar_s *, const struct axbScalar_s *, const struct axbVec_s *, const struct axbVec_s *, void*)) op_desc.func;
  op(z, alpha, beta, gamma, x, y, op_desc.func_data);
  return 0;
}